

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

int arkInterpSetDegree_Hermite(ARKodeMem_conflict ark_mem,ARKInterp interp,int degree)

{
  if (5 < (uint)degree) {
    arkProcessError(ark_mem,-0x28,0x133,"arkInterpSetDegree_Hermite",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_interp.c"
                    ,"Illegal degree specified.");
    return -0x16;
  }
  *(int *)interp->content = degree;
  return 0;
}

Assistant:

int arkInterpSetDegree_Hermite(ARKodeMem ark_mem, ARKInterp interp, int degree)
{
  if (degree > ARK_INTERP_MAX_DEGREE || degree < 0)
  {
    arkProcessError(ark_mem, ARK_INTERP_FAIL, __LINE__, __func__, __FILE__,
                    "Illegal degree specified.");
    return ARK_ILL_INPUT;
  }

  HINT_DEGREE(interp) = degree;

  return ARK_SUCCESS;
}